

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O0

void __thiscall CVmUndo::drop_oldest_savept(CVmUndo *this)

{
  CVmObject *pCVar1;
  CVmUndo *in_RDI;
  bool bVar2;
  CVmUndoMeta *meta;
  CVmUndoMeta *local_10 [2];
  
  if (in_RDI->savept_cnt_ != 0) {
    in_RDI->savept_cnt_ = in_RDI->savept_cnt_ - 1;
    if (in_RDI->oldest_first_ != (CVmUndoMeta *)0x0) {
      local_10[0] = in_RDI->oldest_first_;
      inc_rec_ptr(in_RDI,local_10);
      while( true ) {
        bVar2 = false;
        if (local_10[0] != (in_RDI->oldest_first_->link).next_first) {
          bVar2 = local_10[0] != in_RDI->next_free_;
        }
        if (!bVar2) break;
        if ((local_10[0]->rec).obj != 0) {
          pCVar1 = vm_objp(0);
          (*pCVar1->_vptr_CVmObject[0x15])(pCVar1,local_10[0]);
        }
        inc_rec_ptr(in_RDI,local_10);
      }
      in_RDI->oldest_first_ = (in_RDI->oldest_first_->link).next_first;
      if (in_RDI->oldest_first_ != (CVmUndoMeta *)0x0) {
        (in_RDI->oldest_first_->link).prev_first = (CVmUndoMeta *)0x0;
      }
    }
    if (in_RDI->oldest_first_ == (CVmUndoMeta *)0x0) {
      in_RDI->cur_first_ = (CVmUndoMeta *)0x0;
    }
  }
  return;
}

Assistant:

void CVmUndo::drop_oldest_savept(VMG0_)
{
    /* if there are no savepoints, there's nothing to do */
    if (savept_cnt_ == 0)
        return;

    /* decrement the savepoint count, now that this one is gone */
    --savept_cnt_;

    /* forget the oldest lead pointer */
    if (oldest_first_ != 0)
    {
        /* 
         *   discard records from the oldest lead pointer to the next
         *   oldest lead pointer 
         */
        CVmUndoMeta *meta;
        for (meta = oldest_first_, inc_rec_ptr(&meta) ;
             meta != oldest_first_->link.next_first && meta != next_free_ ; )
        {
            /* discard this entry, if it still exists */
            if (meta->rec.obj != VM_INVALID_OBJ)
                vm_objp(vmg_ meta->rec.obj)->discard_undo(vmg_ &meta->rec);
            
            /* advance to the next record */
            inc_rec_ptr(&meta);
        }
        
        /* advance the oldest pointer to the next savepoint's first record */
        oldest_first_ = oldest_first_->link.next_first;

        /* there's now nothing before this one */
        if (oldest_first_ != 0)
            oldest_first_->link.prev_first = 0;
    }

    /* if we don't have an oldest, we also don't have a current */
    if (oldest_first_ == 0)
        cur_first_ = 0;
}